

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btSoftBody::Node>::resize
          (btAlignedObjectArray<btSoftBody::Node> *this,int newsize,Node *fillData)

{
  int iVar1;
  long lVar2;
  Node *pNVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  
  bVar7 = 0;
  iVar1 = this->m_size;
  lVar6 = (long)iVar1;
  if (iVar1 <= newsize) {
    if (iVar1 < newsize) {
      reserve(this,newsize);
    }
    lVar5 = lVar6 * 0x78;
    for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
      pNVar3 = fillData;
      puVar4 = (undefined8 *)
               ((long)&(((Node *)(&this->m_data->m_x + -1))->super_Feature).super_Element.m_tag +
               lVar5);
      for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = (pNVar3->super_Feature).super_Element.m_tag;
        pNVar3 = (Node *)((long)pNVar3 + (ulong)bVar7 * -0x10 + 8);
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
      }
      lVar5 = lVar5 + 0x78;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}